

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

object * wiz_create_object_from_kind(object_kind *kind)

{
  _Bool _Var1;
  object *local_18;
  object *obj;
  object_kind *kind_local;
  
  _Var1 = tval_is_money_k(kind);
  if (_Var1) {
    local_18 = make_gold((int)player->depth,kind->name);
  }
  else {
    local_18 = object_new();
    object_prep(local_18,kind,(int)player->depth,RANDOMISE);
    apply_magic(local_18,(int)player->depth,false,false,false,false);
  }
  return local_18;
}

Assistant:

static struct object *wiz_create_object_from_kind(struct object_kind *kind)
{
	struct object *obj;

	if (tval_is_money_k(kind)) {
		obj = make_gold(player->depth, kind->name);
	} else {
		obj = object_new();
		object_prep(obj, kind, player->depth, RANDOMISE);

		/* Apply magic (no messages, no artifacts) */
		apply_magic(obj, player->depth, false, false, false, false);
	}

	return obj;
}